

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_EqualitySymmetry_Test::TestBody
          (StatePointer_EqualitySymmetry_Test *this)

{
  bool bVar1;
  char *pcVar2;
  state_type state;
  type local_5c;
  Foo foo;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p1;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p2;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p3;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffa8,
             &local_5c,1);
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr(&p1,&local_5c,1);
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            (&p2,&DAT_00000002,state);
  testing::internal::EqHelper<false>::
  Compare<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((EqHelper<false> *)&p3,"p1","p2",
             (state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffa8,
             &p1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p3);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p3);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p3);
  testing::internal::EqHelper<false>::
  Compare<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((EqHelper<false> *)&p3,"p2","p1",&p1,
             (state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffa8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p3);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p3);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p3);
  testing::internal::
  CmpHelperNE<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((internal *)&p3,"p1","p3",
             (state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffa8,
             &p2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p3);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p3);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p3);
  testing::internal::
  CmpHelperNE<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((internal *)&p3,"p3","p1",&p2,
             (state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffa8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p3);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p3);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p3);
  testing::internal::
  CmpHelperNE<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((internal *)&p3,"p2","p3",&p1,&p2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p3);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p3);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p3);
  testing::internal::
  CmpHelperNE<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((internal *)&p3,"p3","p2",&p2,&p1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p3);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p3);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p3);
  return;
}

Assistant:

TEST(StatePointer, EqualitySymmetry) {
	Foo foo;
	state_ptr<Foo> p1{&foo, 1};
	state_ptr<Foo> p2{&foo, 1};
	state_ptr<Foo> p3{nullptr, 2};

	EXPECT_EQ(p1, p2);
	EXPECT_EQ(p2, p1);

	EXPECT_NE(p1, p3);
	EXPECT_NE(p3, p1);

	EXPECT_NE(p2, p3);
	EXPECT_NE(p3, p2);
}